

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int quicly_foreach_stream
              (quicly_conn_t *conn,void *thunk,_func_int_void_ptr_quicly_stream_t_ptr *cb)

{
  long lVar1;
  int iVar2;
  code *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  int ret;
  khint_t __i;
  quicly_stream_t *stream;
  uint local_2c;
  
  local_2c = 0;
  while( true ) {
    if (local_2c == **(uint **)(in_RDI + 0x548)) {
      return 0;
    }
    if ((((*(uint *)(*(long *)(*(long *)(in_RDI + 0x548) + 0x10) + (ulong)(local_2c >> 4) * 4) >>
           (sbyte)((local_2c & 0xf) << 1) & 3) == 0) &&
        (lVar1 = *(long *)(*(long *)(*(long *)(in_RDI + 0x548) + 0x20) + (ulong)local_2c * 8),
        -1 < *(long *)(lVar1 + 8))) && (iVar2 = (*in_RDX)(in_RSI,lVar1), iVar2 != 0)) break;
    local_2c = local_2c + 1;
  }
  return iVar2;
}

Assistant:

int quicly_foreach_stream(quicly_conn_t *conn, void *thunk, int (*cb)(void *thunk, quicly_stream_t *stream))
{
    quicly_stream_t *stream;
    kh_foreach_value(conn->streams, stream, {
        if (stream->stream_id >= 0) {
            int ret = cb(thunk, stream);
            if (ret != 0)
                return ret;
        }
    });
    return 0;
}